

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void __thiscall
pbrt::PixelStatsAccumulator::ReportPixelMS(PixelStatsAccumulator *this,Point2i *p,float ms)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  Allocator alloc;
  Point2i p_00;
  Point2i resolution;
  PixelStats *pPVar2;
  Float FVar3;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  ColorEncodingHandle local_d0;
  Image local_c8;
  
  pPVar2 = this->stats;
  TVar1 = (pPVar2->time).resolution.super_Tuple2<pbrt::Point2,_int>;
  if (TVar1.y != DAT_02d4dc7c - DAT_02d4dc74 || TVar1.x != DAT_02d4dc78 - imageBounds) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    resolution.super_Tuple2<pbrt::Point2,_int>.y = DAT_02d4dc7c - DAT_02d4dc74;
    resolution.super_Tuple2<pbrt::Point2,_int>.x = DAT_02d4dc78 - imageBounds;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"ms","");
    local_d0.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = 1;
    channels.ptr = &local_f0;
    Image::Image(&local_c8,Float,resolution,channels,&local_d0,alloc);
    pPVar2 = this->stats;
    (pPVar2->time).resolution.super_Tuple2<pbrt::Point2,_int>.y =
         local_c8.resolution.super_Tuple2<pbrt::Point2,_int>.y;
    (pPVar2->time).format = local_c8.format;
    (pPVar2->time).resolution.super_Tuple2<pbrt::Point2,_int>.x =
         local_c8.resolution.super_Tuple2<pbrt::Point2,_int>.x;
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(pPVar2->time).channelNames,&local_c8.channelNames);
    (pPVar2->time).encoding.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (uintptr_t)
            local_c8.encoding.
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&(pPVar2->time).p8,&local_c8.p8);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&(pPVar2->time).p16,&local_c8.p16);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&(pPVar2->time).p32,&local_c8.p32);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_c8.p32);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_c8.p16);
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              (&local_c8.p8);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8.channelNames);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    pPVar2 = this->stats;
  }
  p_00.super_Tuple2<pbrt::Point2,_int>.x = (p->super_Tuple2<pbrt::Point2,_int>).x - imageBounds;
  p_00.super_Tuple2<pbrt::Point2,_int>.y = (p->super_Tuple2<pbrt::Point2,_int>).y - DAT_02d4dc74;
  FVar3 = Image::GetChannel(&pPVar2->time,p_00,0,(WrapMode2D)0x200000002);
  Image::SetChannel(&pPVar2->time,p_00,0,FVar3 + ms);
  return;
}

Assistant:

void PixelStatsAccumulator::ReportPixelMS(const Point2i &p, float ms) {
    Point2i res = Point2i(imageBounds.Diagonal());
    if (stats->time.Resolution() != res)
        stats->time = Image(PixelFormat::Float, res, {"ms"});

    Point2i pp = Point2i(p - imageBounds.pMin);
    stats->time.SetChannel(pp, 0, stats->time.GetChannel(pp, 0) + ms);
}